

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_> *
testing::Truly<(anonymous_namespace)::first_elements_are>
          (PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
           *__return_storage_ptr__,first_elements_are *pred)

{
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)pred);
  std::__cxx11::string::string(local_50,local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

inline PolymorphicMatcher<internal::TrulyMatcher<Predicate> >
Truly(Predicate pred) {
  return MakePolymorphicMatcher(internal::TrulyMatcher<Predicate>(pred));
}